

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

void Qiniu_Rio_SetSettings(Qiniu_Rio_Settings *v)

{
  Qiniu_Rio_Settings *v_local;
  
  settings.taskQsize = v->taskQsize;
  settings.workers = v->workers;
  settings.chunkSize = v->chunkSize;
  settings.tryTimes = v->tryTimes;
  settings.threadModel.self = (v->threadModel).self;
  settings.threadModel.itbl = (v->threadModel).itbl;
  if (settings.workers == 0) {
    settings.workers = 4;
  }
  if (settings.taskQsize == 0) {
    settings.taskQsize = settings.workers << 2;
  }
  if (settings.chunkSize == 0) {
    settings.chunkSize = 0x400000;
  }
  if (settings.tryTimes == 0) {
    settings.tryTimes = 3;
  }
  if (settings.threadModel.itbl == (Qiniu_Rio_ThreadModel_Itbl *)0x0) {
    settings.threadModel.self = Qiniu_Rio_ST.self;
    settings.threadModel.itbl = Qiniu_Rio_ST.itbl;
  }
  return;
}

Assistant:

void Qiniu_Rio_SetSettings(Qiniu_Rio_Settings *v)
{
    settings = *v;
    if (settings.workers == 0)
    {
        settings.workers = defaultWorkers;
    }
    if (settings.taskQsize == 0)
    {
        settings.taskQsize = settings.workers * 4;
    }
    if (settings.chunkSize == 0)
    {
        settings.chunkSize = defaultChunkSize;
    }
    if (settings.tryTimes == 0)
    {
        settings.tryTimes = defaultTryTimes;
    }
    if (settings.threadModel.itbl == NULL)
    {
        settings.threadModel = Qiniu_Rio_ST;
    }
}